

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_user_cmd.cxx
# Opt level: O1

ptr<cmd_result<ptr<buffer>_>_> __thiscall
nuraft::raft_server::send_msg_to_leader
          (raft_server *this,ptr<req_msg> *req,req_ext_params *ext_params)

{
  cmd_result_code code;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _func_int **pp_Var2;
  element_type *peVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  req_ext_params *prVar7;
  char cVar8;
  int iVar9;
  int iVar10;
  element_type *peVar11;
  element_type *peVar12;
  mapped_type *pmVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  char *pcVar14;
  ulong uVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_08;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_09;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_10;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_11;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_12;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_14;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_16;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_17;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_18;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_20;
  _func_int *p_Var16;
  _func_int **pp_Var17;
  _func_int **pp_Var18;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *__tmp_2;
  cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *__tmp_1;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var19;
  bool bVar20;
  ptr<resp_msg> pVar21;
  ptr<cmd_result<ptr<buffer>_>_> pVar22;
  int32 leader_id;
  ptr<srv_config> srv_conf;
  rpc_handler handler;
  ptr<buffer> result;
  ptr<raft_params> params;
  unique_lock<std::mutex> l;
  ptr<cluster_config> c_conf;
  uint local_13c;
  undefined1 local_138 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_128;
  _func_int **local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  _List_node_base *p_Stack_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  undefined1 local_e8 [16];
  code *local_d8;
  code *pcStack_d0;
  undefined1 local_c8 [16];
  shared_ptr<nuraft::rpc_client> local_b8;
  shared_ptr<nuraft::buffer> local_a8;
  req_ext_params *local_98;
  pthread_mutex_t *local_90;
  int local_84;
  long local_80;
  element_type *local_78;
  _func_int **local_70;
  ulong local_68;
  unique_lock<std::mutex> local_60;
  _func_int **local_50;
  element_type *local_48;
  __weak_count<(__gnu_cxx::_Lock_policy)2> local_40;
  thread local_38;
  
  local_13c = *(uint *)((long)&req[3].
                               super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                               _M_ptr + 4);
  local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_13c == 0xffffffff) {
    p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (iVar9 = (*p_Var1->_vptr__Sp_counted_base[7])(), 3 < iVar9)) {
      p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      msg_if_given_abi_cxx11_
                ((string *)local_138,"return null as leader does not exist in the current group");
      (*p_Var1->_vptr__Sp_counted_base[8])
                (p_Var1,4,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                 ,"send_msg_to_leader",0x77,local_138);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x10)) {
        operator_delete((void *)local_138._0_8_);
      }
    }
    this->_vptr_raft_server = (_func_int **)0x0;
    peVar11 = (element_type *)operator_new(0xe0);
LAB_001df39e:
    (peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x100000001;
    peVar11->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005b27b8;
    p_Var19 = &(peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
               super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
              ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
               p_Var19,&local_a8,NOT_LEADER);
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
    this->_vptr_raft_server = (_func_int **)p_Var19;
    pcVar14 = (char *)extraout_RDX_02;
  }
  else {
    if (local_13c ==
        *(uint *)&req[3].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                  ._M_pi) {
      (**(code **)&(((req->super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                   ->super_msg_base).type_)
                (local_e8,req,
                 *(undefined8 *)&(ext_params->after_precommit_).super__Function_base._M_functor);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar9 = (*p_Var1->_vptr__Sp_counted_base[7])(), 3 < iVar9)) {
          p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_((string *)local_138,"server returns null");
          (*p_Var1->_vptr__Sp_counted_base[8])
                    (p_Var1,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0x80,local_138);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
        }
        this->_vptr_raft_server = (_func_int **)0x0;
        peVar11 = (element_type *)operator_new(0xe0);
        (peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x100000001;
        peVar11->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005b27b8;
        p_Var19 = &(peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
        cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
                  ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_> *)
                   p_Var19,&local_a8,BAD_REQUEST);
        (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
        this->_vptr_raft_server = (_func_int **)p_Var19;
        pcVar14 = (char *)extraout_RDX_03;
        local_78 = (element_type *)local_e8._8_8_;
      }
      else {
        this->_vptr_raft_server = (_func_int **)0x0;
        (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        pcVar14 = (char *)extraout_RDX;
        if ((((mutex *)(local_e8._0_8_ + 0x68))->super___mutex_base)._M_mutex.__align != 0) {
          pVar21 = resp_msg::call_cb((resp_msg *)local_138,(ptr<resp_msg> *)local_e8._0_8_);
          uVar4 = local_e8._8_8_;
          local_e8._8_8_ = local_138._8_8_;
          local_e8._0_8_ = local_138._0_8_;
          pcVar14 = (char *)pVar21.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
          local_138._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_138._8_8_ = (element_type *)0x0;
          if ((element_type *)uVar4 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
            pcVar14 = (char *)extraout_RDX_00;
          }
          if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
            pcVar14 = (char *)extraout_RDX_01;
          }
        }
        _Var6._M_pi = local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        if (*(char *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x30))->
                      _vptr__Sp_counted_base == '\x01') {
          local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (((mutex *)(local_e8._0_8_ + 0x38))->super___mutex_base)._M_mutex.__align;
          p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x40))->
                   _vptr__Sp_counted_base;
          if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            pcVar14 = &__libc_single_threaded;
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var1->_M_use_count = p_Var1->_M_use_count + 1;
            }
          }
          bVar20 = local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = p_Var1;
          if (bVar20) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
            pcVar14 = (char *)extraout_RDX_04;
          }
          if (*(__node_base_ptr *)(local_e8._0_8_ + 0x88) != (__node_base_ptr)0x0) {
            (*(code *)((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x90))->
                      _vptr__Sp_counted_base)(local_138);
            uVar5 = local_138._8_8_;
            uVar4 = local_138._0_8_;
            local_138._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_138._8_8_ = (element_type *)0x0;
            peVar11 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                      super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            this->_vptr_raft_server = (_func_int **)uVar4;
            (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)uVar5;
            pcVar14 = (char *)extraout_RDX_05;
            if (peVar11 != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar11);
              pcVar14 = (char *)extraout_RDX_06;
            }
            if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
              pcVar14 = (char *)extraout_RDX_07;
            }
          }
        }
        if ((_List_node_base *)
            local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (_List_node_base *)0x0) {
          buffer::pos(local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      ,0);
          pcVar14 = (char *)extraout_RDX_08;
        }
        local_78 = (element_type *)local_e8._8_8_;
        if (this->_vptr_raft_server == (_func_int **)0x0) {
          bVar20 = *(bool *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                             (local_e8._0_8_ + 0x30))->_vptr__Sp_counted_base;
          code = *(_Atomic_word *)(local_e8._0_8_ + 0x98);
          peVar12 = (element_type *)operator_new(0xe0);
          (peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x100000001;
          peVar12->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005b27b8;
          p_Var19 = &(peVar12->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                     super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
                    ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                      *)p_Var19,&local_a8,bVar20,code);
          this->_vptr_raft_server = (_func_int **)p_Var19;
          peVar11 = (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar12;
          pcVar14 = (char *)extraout_RDX_09;
          local_78 = (element_type *)local_e8._8_8_;
          if (peVar11 != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar11);
            pcVar14 = (char *)extraout_RDX_10;
            local_78 = (element_type *)local_e8._8_8_;
          }
        }
      }
    }
    else {
      context::get_params((context *)local_138);
      cVar8 = *(char *)(local_138._0_8_ + 0x49);
      if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
      }
      if (cVar8 == '\0') {
        this->_vptr_raft_server = (_func_int **)0x0;
        peVar11 = (element_type *)operator_new(0xe0);
        goto LAB_001df39e;
      }
      context::get_params((context *)&local_80);
      local_84 = *(int *)(local_80 + 0x58);
      local_68 = 1;
      if (1 < (int)*(uint *)(local_80 + 0x4c)) {
        local_68 = (ulong)*(uint *)(local_80 + 0x4c);
      }
      local_98 = ext_params;
      get_config((raft_server *)&stack0xffffffffffffffb0);
      local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_c8._0_8_ = (element_type *)0x0;
      local_c8._8_8_ = (element_type *)0x0;
      iVar9 = pthread_mutex_lock((pthread_mutex_t *)(req + 0x4b));
      if (iVar9 != 0) {
        std::__throw_system_error(iVar9);
      }
      p_Var1 = req[0x25].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      uVar15 = (ulong)(long)(int)local_13c % (ulong)p_Var1;
      pp_Var17 = (&((req[0x25].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->super_msg_base)._vptr_msg_base)[uVar15];
      pp_Var18 = (_func_int **)0x0;
      if ((pp_Var17 != (_func_int **)0x0) &&
         (pp_Var2 = (_func_int **)*pp_Var17, pp_Var18 = pp_Var17,
         local_13c != *(uint *)((long)*pp_Var17 + 8))) {
        while (pp_Var17 = pp_Var2, pp_Var2 = (_func_int **)*pp_Var17, pp_Var2 != (_func_int **)0x0)
        {
          pp_Var18 = (_func_int **)0x0;
          if (((ulong)(long)(int)*(uint *)(pp_Var2 + 1) % (ulong)p_Var1 != uVar15) ||
             (pp_Var18 = pp_Var17, local_13c == *(uint *)(pp_Var2 + 1))) goto LAB_001df5aa;
        }
        pp_Var18 = (_func_int **)0x0;
      }
LAB_001df5aa:
      if (pp_Var18 == (_func_int **)0x0) {
        p_Var16 = (_func_int *)0x0;
      }
      else {
        p_Var16 = *pp_Var18;
      }
      if (p_Var16 == (_func_int *)0x0) {
        local_138._0_8_ = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<nuraft::raft_server::auto_fwd_pkg,std::allocator<nuraft::raft_server::auto_fwd_pkg>>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),
                   (auto_fwd_pkg **)local_138,
                   (allocator<nuraft::raft_server::auto_fwd_pkg> *)local_e8);
        uVar4 = local_c8._8_8_;
        local_c8._8_8_ = local_138._8_8_;
        local_c8._0_8_ = local_138._0_8_;
        local_138._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_138._8_8_ = (element_type *)0x0;
        if ((element_type *)uVar4 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
        }
        if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
        }
        pmVar13 = std::__detail::
                  _Map_base<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<int,_std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>,_std::allocator<std::pair<const_int,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)(req + 0x25),(key_type *)&local_13c);
        (pmVar13->super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>)
        ._M_ptr = (element_type *)local_c8._0_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&(pmVar13->
                    super___shared_ptr<nuraft::raft_server::auto_fwd_pkg,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
        p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar9 = (*p_Var1->_vptr__Sp_counted_base[7])(), 5 < iVar9)) {
          p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_138,"auto forwarding pkg for leader %d not found, created %p",
                     (ulong)local_13c,local_c8._0_8_);
          (*p_Var1->_vptr__Sp_counted_base[8])
                    (p_Var1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xbb,local_138);
          goto LAB_001df72e;
        }
      }
      else {
        local_c8._0_8_ = *(undefined8 *)(p_Var16 + 0x10);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8),
                   (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(p_Var16 + 0x18));
        p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
        if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (iVar9 = (*p_Var1->_vptr__Sp_counted_base[7])(), 5 < iVar9)) {
          p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          msg_if_given_abi_cxx11_
                    ((string *)local_138,"auto forwarding pkg for leader %d exists %p",
                     (ulong)local_13c,local_c8._0_8_);
          (*p_Var1->_vptr__Sp_counted_base[8])
                    (p_Var1,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                     ,"send_msg_to_leader",0xbf,local_138);
LAB_001df72e:
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x10)) {
            operator_delete((void *)local_138._0_8_);
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)(req + 0x4b));
      local_38._M_id._M_thread =
           (id)((long)&(local_98->after_precommit_).super__Function_base._M_functor + 8);
      local_90 = (pthread_mutex_t *)(req + 0x2a);
      local_40._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           &req[0x28].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      local_70 = (_func_int **)&PTR___Sp_counted_ptr_inplace_005b27b8;
      do {
        local_60._M_device = (mutex_type *)(local_c8._0_8_ + 0x50);
        local_60._M_owns = false;
        std::unique_lock<std::mutex>::lock(&local_60);
        local_60._M_owns = true;
        peVar3 = (element_type *)
                 (((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                    *)local_c8._0_8_)->
                 super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                 )._M_impl._M_node.super__List_node_base._M_next;
        if (peVar3 == (element_type *)local_c8._0_8_) {
          p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (iVar9 = (*p_Var1->_vptr__Sp_counted_base[7])(), 5 < iVar9)) {
            p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            msg_if_given_abi_cxx11_
                      ((string *)local_138,"no connection available, idle %zu, in-use %zu, max %zu",
                       (((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                          *)local_c8._0_8_)->
                       super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                       )._M_impl._M_node._M_size,
                       (((unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                          *)(local_c8._0_8_ + 0x18))->_M_h)._M_element_count,local_68);
            (*p_Var1->_vptr__Sp_counted_base[8])
                      (p_Var1,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                       ,"send_msg_to_leader",0xce,(cluster_config *)local_138);
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x10)) {
              operator_delete((void *)local_138._0_8_);
            }
          }
          if ((((unordered_set<std::shared_ptr<nuraft::rpc_client>,_std::hash<std::shared_ptr<nuraft::rpc_client>_>,_std::equal_to<std::shared_ptr<nuraft::rpc_client>_>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                 *)(local_c8._0_8_ + 0x18))->_M_h)._M_element_count +
              (((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                 *)local_c8._0_8_)->
              super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
              )._M_impl._M_node._M_size < local_68) {
            cluster_config::get_server((cluster_config *)local_e8,(int)local_50);
            pp_Var17 = req[0x15].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[4]._vptr__Sp_counted_base;
            (**(code **)(*pp_Var17 + 0x10))
                      ((cluster_config *)local_138,pp_Var17,(size_type *)(local_e8._0_8_ + 8));
            _Var6._M_pi = local_b8.
                          super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_;
            local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_138._0_8_;
            local_138._0_8_ = (_func_int **)0x0;
            local_138._8_8_ = (element_type *)0x0;
            if ((element_type *)_Var6._M_pi != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
            }
            if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
            }
            local_138._0_8_ = local_c8._0_8_ + 0x18;
            std::
            _Hashtable<std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::rpc_client>,std::allocator<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<nuraft::rpc_client>>,std::hash<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<std::shared_ptr<nuraft::rpc_client>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<nuraft::rpc_client>,false>>>>
                      ((_Hashtable<std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::rpc_client>,std::allocator<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<nuraft::rpc_client>>,std::hash<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)local_138._0_8_,&local_b8,(cluster_config *)local_138);
            p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (iVar9 = (*p_Var1->_vptr__Sp_counted_base[7])(), 5 < iVar9)) {
              p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              msg_if_given_abi_cxx11_
                        ((string *)local_138,"created a new connection %p",
                         local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
              (*p_Var1->_vptr__Sp_counted_base[8])
                        (p_Var1,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                         ,"send_msg_to_leader",0xd6,(cluster_config *)local_138);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x10)) {
                operator_delete((void *)local_138._0_8_);
              }
            }
            if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
            }
            iVar9 = 2;
          }
          else if (local_84 == 0) {
            std::unique_lock<std::mutex>::unlock(&local_60);
            p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (iVar9 = (*p_Var1->_vptr__Sp_counted_base[7])(), 5 < iVar9)) {
              p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              msg_if_given_abi_cxx11_((string *)local_138,"reached max connection, wait");
              (*p_Var1->_vptr__Sp_counted_base[8])
                        (p_Var1,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                         ,"send_msg_to_leader",0xdd,(cluster_config *)local_138);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x10)) {
                operator_delete((void *)local_138._0_8_);
              }
            }
            EventAwaiter::wait_us
                      ((EventAwaiter *)(local_c8._0_8_ + 0x78),
                       (long)*(int *)(local_80 + 0x2c) * 1000);
            LOCK();
            (((EventAwaiter *)(local_c8._0_8_ + 0x78))->status)._M_i = idle;
            UNLOCK();
            p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            iVar9 = 3;
            if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (iVar10 = (*p_Var1->_vptr__Sp_counted_base[7])(), 5 < iVar10)) {
              p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              msg_if_given_abi_cxx11_((string *)local_138,"wake up, find an available connection");
              (*p_Var1->_vptr__Sp_counted_base[8])
                        (p_Var1,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                         ,"send_msg_to_leader",0xe0,(cluster_config *)local_138);
              iVar9 = 3;
              goto LAB_001df920;
            }
          }
          else {
            local_128._M_allocated_capacity = 0;
            local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_138._8_8_ = (element_type *)0x0;
            local_138._0_8_ =
                 *(undefined8 *)&(local_98->after_precommit_).super__Function_base._M_functor;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 8),
                       (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_38._M_id._M_thread);
            peVar11 = (element_type *)operator_new(0xe0);
            (peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x100000001;
            peVar11->_vptr_raft_server = local_70;
            p_Var19 = &(peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                       super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ;
            (peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            (peVar11->bg_commit_thread_)._M_id._M_thread = 0;
            (peVar11->bg_append_thread_)._M_id._M_thread = 0;
            peVar11->bg_append_ea_ = (EventAwaiter *)0x0;
            *(undefined8 *)&(peVar11->initialized_)._M_base = 0;
            peVar11->id_ = 0;
            peVar11->my_priority_ = 0;
            *(undefined8 *)((long)&peVar11->my_priority_ + 2) = 0;
            (peVar11->priority_change_timer_).t_created_.__d.__r = 0;
            (peVar11->priority_change_timer_).duration_us_ = 0;
            *(undefined8 *)&(peVar11->priority_change_timer_).first_event_fired_ = 0;
            (peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
            *(undefined8 *)
             ((long)&(peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) = 0;
            *(undefined8 *)
             ((long)&(peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10) = 0
            ;
            (peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev
                 = (__pthread_internal_list *)0x0;
            (peVar11->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next
                 = (__pthread_internal_list *)0x0;
            peVar11->votes_responded_ = 0;
            peVar11->votes_granted_ = 0;
            (peVar11->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
            (peVar11->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
            (peVar11->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
            (peVar11->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
            std::condition_variable::condition_variable
                      ((condition_variable *)&peVar11->lagging_sm_target_index_);
            uVar4 = local_128._8_8_;
            bVar20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
                     (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_128._M_allocated_capacity = (size_type)p_Var19;
            local_128._8_8_ = peVar11;
            if (bVar20) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar4);
            }
            iVar9 = pthread_mutex_lock(local_90);
            if (iVar9 != 0) {
              std::__throw_system_error(iVar9);
            }
            std::__cxx11::
            list<nuraft::raft_server::auto_fwd_req_resp,std::allocator<nuraft::raft_server::auto_fwd_req_resp>>
            ::_M_insert<nuraft::raft_server::auto_fwd_req_resp_const&>
                      ((list<nuraft::raft_server::auto_fwd_req_resp,std::allocator<nuraft::raft_server::auto_fwd_req_resp>>
                        *)local_40._M_pi,(iterator)local_40._M_pi,(auto_fwd_req_resp *)local_138);
            p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (iVar9 = (*p_Var1->_vptr__Sp_counted_base[7])(), 5 < iVar9)) {
              p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi;
              msg_if_given_abi_cxx11_
                        ((string *)local_e8,"reached max connection, put into the queue, %zu elems",
                         req[0x29].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi);
              (*p_Var1->_vptr__Sp_counted_base[8])
                        (p_Var1,6,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                         ,"send_msg_to_leader",0xec,(string *)local_e8);
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&local_d8) {
                operator_delete((void *)local_e8._0_8_);
              }
            }
            this->_vptr_raft_server = (_func_int **)local_128._M_allocated_capacity;
            (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_128._8_8_;
            if ((element_type *)local_128._8_8_ != (element_type *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)(local_128._8_8_ + 8))->
                         _M_weak_this).
                         super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)
                               (local_128._8_8_ + 8))->_M_weak_this).
                              super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 1;
                UNLOCK();
              }
              else {
                *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)(local_128._8_8_ + 8))->
                         _M_weak_this).
                         super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     *(int *)&(((enable_shared_from_this<nuraft::raft_server> *)
                               (local_128._8_8_ + 8))->_M_weak_this).
                              super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr + 1;
              }
            }
            pthread_mutex_unlock(local_90);
            if ((element_type *)local_128._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
            }
            if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
            }
            iVar9 = 1;
          }
        }
        else {
          local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)
               (peVar3->rpc_client_idle_).
               super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
               ._M_impl._M_node._M_size;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount,
                     (__shared_count<(__gnu_cxx::_Lock_policy)2> *)&peVar3->rpc_client_in_use_);
          cVar8 = (**(code **)(*(long *)local_b8.
                                        super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_ptr + 0x20))();
          if (cVar8 != '\0') {
            cluster_config::get_server((cluster_config *)local_138,(int)local_50);
            pp_Var17 = req[0x15].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[4]._vptr__Sp_counted_base;
            (**(code **)(*pp_Var17 + 0x10))(local_e8,pp_Var17,(size_type *)(local_138._0_8_ + 8));
            _Var6._M_pi = local_b8.
                          super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
            local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
            local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_e8._0_8_;
            local_e8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_e8._8_8_ = (element_type *)0x0;
            if ((element_type *)_Var6._M_pi != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var6._M_pi);
            }
            if ((element_type *)local_e8._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
            }
            if ((element_type *)local_138._8_8_ != (element_type *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._8_8_);
            }
          }
          std::__cxx11::
          list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
          ::_M_erase((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                      *)local_c8._0_8_,
                     (((list<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                        *)local_c8._0_8_)->
                     super__List_base<std::shared_ptr<nuraft::rpc_client>,_std::allocator<std::shared_ptr<nuraft::rpc_client>_>_>
                     )._M_impl._M_node.super__List_node_base._M_next);
          local_138._0_8_ = local_c8._0_8_ + 0x18;
          std::
          _Hashtable<std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::rpc_client>,std::allocator<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<nuraft::rpc_client>>,std::hash<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<std::shared_ptr<nuraft::rpc_client>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::shared_ptr<nuraft::rpc_client>,false>>>>
                    ((_Hashtable<std::shared_ptr<nuraft::rpc_client>,std::shared_ptr<nuraft::rpc_client>,std::allocator<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Identity,std::equal_to<std::shared_ptr<nuraft::rpc_client>>,std::hash<std::shared_ptr<nuraft::rpc_client>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_138._0_8_,&local_b8,(cluster_config *)local_138);
          p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
          iVar9 = 2;
          if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
             (iVar10 = (*p_Var1->_vptr__Sp_counted_base[7])(), 5 < iVar10)) {
            p_Var1 = req[0x31].super___shared_ptr<nuraft::req_msg,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
            msg_if_given_abi_cxx11_
                      ((string *)local_138,"idle connection %p",
                       local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            (*p_Var1->_vptr__Sp_counted_base[8])
                      (p_Var1,6,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_user_cmd.cxx"
                       ,"send_msg_to_leader",0xfb,(cluster_config *)local_138);
            iVar9 = 2;
LAB_001df920:
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_138 + 0x10)) {
              operator_delete((void *)local_138._0_8_);
            }
          }
        }
        std::unique_lock<std::mutex>::~unique_lock(&local_60);
      } while (iVar9 == 3);
      pcVar14 = (char *)extraout_RDX_11;
      if (iVar9 == 2) {
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          this->_vptr_raft_server = (_func_int **)0x0;
          peVar11 = (element_type *)operator_new(0xe0);
          (peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x100000001;
          peVar11->_vptr_raft_server = local_70;
          p_Var19 = &(peVar11->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                     super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::cmd_result
                    ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                      *)p_Var19,&local_a8,OK);
          (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
          super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar11;
          this->_vptr_raft_server = (_func_int **)p_Var19;
          pcVar14 = (char *)extraout_RDX_15;
        }
        else {
          std::
          __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,(__gnu_cxx::_Lock_policy)2>
          ::
          __shared_ptr<std::allocator<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>>
                    ((__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,(__gnu_cxx::_Lock_policy)2>
                      *)this,(allocator<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                              *)local_138);
          local_138._0_8_ = auto_fwd_resp_handler;
          local_138._8_8_ = (element_type *)0x0;
          std::
          _Tuple_impl<1ul,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>>
          ::
          _Tuple_impl<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>&,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>&,std::shared_ptr<nuraft::rpc_client>&,std::_Placeholder<1>const&,std::_Placeholder<2>const&,void>
                    ((_Tuple_impl<1ul,std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>,std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,std::shared_ptr<nuraft::rpc_client>,std::_Placeholder<1>,std::_Placeholder<2>>
                      *)(local_138 + 0x10),
                     (shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                      *)this,(shared_ptr<nuraft::raft_server::auto_fwd_pkg> *)local_c8,&local_b8,
                     (_Placeholder<1> *)&std::placeholders::_1,
                     (_Placeholder<2> *)&std::placeholders::_2);
          prVar7 = local_98;
          local_e8._0_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_e8._8_8_ = (element_type *)0x0;
          local_d8 = (code *)0x0;
          pcStack_d0 = (_Manager_type)0x0;
          local_f8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)req;
          local_e8._0_8_ = operator_new(0x48);
          ((_Hashtable *)
          &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_)->_vptr__Sp_counted_base)
          ->_M_buckets = (__buckets_ptr)local_138._0_8_;
          *(undefined8 *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._0_8_)->_M_use_count =
               local_138._8_8_;
          *(size_type *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x10))->_M_use_count
               = 0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x10))->
          _vptr__Sp_counted_base = (_func_int **)local_128._M_allocated_capacity;
          *(undefined8 *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x10))->_M_use_count
               = local_128._8_8_;
          *(size_t *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x20))->_M_use_count
               = 0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x20))->
          _vptr__Sp_counted_base = local_118;
          *(size_type *)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x20))->_M_use_count
               = aStack_110._M_allocated_capacity;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x30))->_M_use_count =
               0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x30))->_M_weak_count =
               0;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x30))->
          _vptr__Sp_counted_base = (_func_int **)aStack_110._8_8_;
          *(_List_node_base **)
           &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x30))->_M_use_count
               = p_Stack_100;
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_e8._0_8_ + 0x40))->
          _vptr__Sp_counted_base = (_func_int **)local_f8._M_pi;
          pcStack_d0 = std::
                       _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
                       ::_M_invoke;
          local_d8 = std::
                     _Function_handler<void_(std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&),_std::_Bind<void_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::_Placeholder<1>,_std::_Placeholder<2>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>,_std::shared_ptr<nuraft::raft_server::auto_fwd_pkg>,_std::shared_ptr<nuraft::rpc_client>,_std::shared_ptr<nuraft::resp_msg>_&,_std::shared_ptr<nuraft::rpc_exception>_&)>_>
                     ::_M_manager;
          p_Stack_100 = (_List_node_base *)0x0;
          aStack_110._8_8_ = (__node_base_ptr)0x0;
          aStack_110._M_allocated_capacity = 0;
          local_118 = (_func_int **)0x0;
          local_128._8_8_ = (element_type *)0x0;
          local_128._M_allocated_capacity = 0;
          (**(code **)(*(long *)local_b8.
                                super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                                _M_ptr + 0x10))
                    (local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,prVar7,local_e8,(long)*(int *)(local_80 + 0x5c));
          pcVar14 = (char *)extraout_RDX_12;
          if (*(int *)(local_80 + 0x58) == 0) {
            cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>::get
                      ((cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>
                        *)this->_vptr_raft_server);
            pcVar14 = (char *)extraout_RDX_13;
          }
          if (local_d8 != (code *)0x0) {
            (*local_d8)(local_e8,local_e8,3);
            pcVar14 = (char *)extraout_RDX_14;
          }
        }
      }
      if ((element_type *)local_c8._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_c8._8_8_);
        pcVar14 = (char *)extraout_RDX_16;
      }
      if ((element_type *)
          local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_b8.super___shared_ptr<nuraft::rpc_client,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        pcVar14 = (char *)extraout_RDX_17;
      }
      if (local_48 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48);
        pcVar14 = (char *)extraout_RDX_18;
      }
    }
    if (local_78 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78);
      pcVar14 = (char *)extraout_RDX_19;
    }
  }
  if (local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    pcVar14 = (char *)extraout_RDX_20;
  }
  pVar22.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pcVar14;
  pVar22.
  super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (ptr<cmd_result<ptr<buffer>_>_>)
         pVar22.
         super___shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr< cmd_result< ptr<buffer> > > raft_server::send_msg_to_leader
                                 ( ptr<req_msg>& req,
                                   const req_ext_params& ext_params )
{
    int32 leader_id = leader_;
    ptr<buffer> result = nullptr;
    if (leader_id == -1) {
        p_in("return null as leader does not exist in the current group");
        ptr< cmd_result< ptr<buffer> > > ret =
            cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::NOT_LEADER);
        return ret;
    }

    if (leader_id == id_) {
        ptr<resp_msg> resp = process_req(*req, ext_params);
        if (!resp) {
            p_in("server returns null");
            ptr< cmd_result< ptr<buffer> > > ret =
                cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::BAD_REQUEST);
            return ret;
        }

        ptr< cmd_result< ptr<buffer> > > ret = nullptr;
        if (resp->has_cb()) {
            // Blocking mode:
            //   If callback function exists, get new response message
            //   from the callback function.
            resp = resp->call_cb(resp);
        }

        if (resp->get_accepted()) {
            result = resp->get_ctx();

            if (resp->has_async_cb()) {
                // Async handler mode (only when accepted):
                //   Get handler (async_result) from the callback.
                ret = resp->call_async_cb();
            }
        }
        if (result) {
            result->pos(0);
        }

        if (!ret) {
            // In blocking mode,
            // we already have result when we reach here.
            ret = cs_new< cmd_result< ptr<buffer> > >
                  ( result, resp->get_accepted(), resp->get_result_code() );
        }
        return ret;
    }
    if (!ctx_->get_params()->auto_forwarding_) {
        // Auto-forwarding is disabled, return error.
        ptr< cmd_result< ptr<buffer> > > ret =
            cs_new< cmd_result< ptr<buffer> > >(result, cmd_result_code::NOT_LEADER);
        return ret;
    }

    // Otherwise: re-direct request to the current leader
    //            (not recommended).
    ptr<raft_params> params = ctx_->get_params();
    size_t max_conns =
        std::max(1, params->auto_forwarding_max_connections_);
    bool is_blocking_mode = (params->return_method_ == raft_params::blocking);

    ptr<cluster_config> c_conf = get_config();
    ptr<rpc_client> rpc_cli;
    ptr<auto_fwd_pkg> cur_pkg = nullptr;
    {
        auto_lock(rpc_clients_lock_);
        auto entry = auto_fwd_pkgs_.find(leader_id);
        if (entry == auto_fwd_pkgs_.end()) {
            cur_pkg = cs_new<auto_fwd_pkg>();
            auto_fwd_pkgs_[leader_id] = cur_pkg;
            p_tr("auto forwarding pkg for leader %d not found, created %p",
                 leader_id, cur_pkg.get());
        } else {
            cur_pkg = entry->second;
            p_tr("auto forwarding pkg for leader %d exists %p",
                 leader_id, cur_pkg.get());
        }
    }

    // Find available `rpc_cli`.
    do {
        std::unique_lock<std::mutex> l(cur_pkg->lock_);
        // Get an idle connection.
        auto e_rpc = cur_pkg->rpc_client_idle_.begin();
        if (e_rpc == cur_pkg->rpc_client_idle_.end()) {
            // Idle connection doesn't exist,
            // check the total number of connections.
            p_tr( "no connection available, idle %zu, in-use %zu, max %zu",
                   cur_pkg->rpc_client_idle_.size(),
                   cur_pkg->rpc_client_in_use_.size(),
                   max_conns );
            if ( cur_pkg->rpc_client_idle_.size() +
                 cur_pkg->rpc_client_in_use_.size() < max_conns ) {
                // We can create more connections.
                ptr<srv_config> srv_conf = c_conf->get_server(leader_id);
                rpc_cli = ctx_->rpc_cli_factory_->create_client
                          ( srv_conf->get_endpoint() );
                cur_pkg->rpc_client_in_use_.insert(rpc_cli);
                p_tr("created a new connection %p", rpc_cli.get());

            } else {
                // Already reached the max, wait for idle connection.
                if (is_blocking_mode) {
                    // Blocking mode, sleep here.
                    l.unlock();
                    p_tr("reached max connection, wait");
                    cur_pkg->ea_.wait_ms(params->client_req_timeout_);
                    cur_pkg->ea_.reset();
                    p_tr("wake up, find an available connection");
                    continue;

                } else {
                    // Async mode, put it into the queue, and return immediately.
                    auto_fwd_req_resp req_resp_pair;
                    req_resp_pair.req = req;
                    req_resp_pair.resp = cs_new< cmd_result< ptr<buffer> > >();

                    auto_lock(auto_fwd_reqs_lock_);
                    auto_fwd_reqs_.push_back(req_resp_pair);
                    p_tr("reached max connection, put into the queue, %zu elems",
                         auto_fwd_reqs_.size());
                    return req_resp_pair.resp;
                }
            }
        } else {
            // Put the idle connection to in-use list.
            rpc_cli = *e_rpc;
            if (rpc_cli->is_abandoned()) {
                // Abandoned connection, need to reconnect.
                ptr<srv_config> srv_conf = c_conf->get_server(leader_id);
                rpc_cli = ctx_->rpc_cli_factory_->create_client
                          ( srv_conf->get_endpoint() );
            }
            cur_pkg->rpc_client_idle_.pop_front();
            cur_pkg->rpc_client_in_use_.insert(rpc_cli);
            p_tr("idle connection %p", rpc_cli.get());
        }
        break;
    } while(true);

    if (!rpc_cli) {
        return cs_new< cmd_result< ptr<buffer> > >(result);
    }

    ptr< cmd_result< ptr<buffer> > >
        presult( cs_new< cmd_result< ptr<buffer> > >() );

    rpc_handler handler = std::bind( &raft_server::auto_fwd_resp_handler,
                                     this,
                                     presult,
                                     cur_pkg,
                                     rpc_cli,
                                     std::placeholders::_1,
                                     std::placeholders::_2 );
    rpc_cli->send(req, handler, params->auto_forwarding_req_timeout_);

    if (params->return_method_ == raft_params::blocking) {
        presult->get();
    }

    return presult;
}